

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O2

result_type __thiscall iutest::detail::iuRandom::Engine::gen(Engine *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->m_v1 << 0xb ^ this->m_v1;
  this->m_v1 = this->m_v2;
  this->m_v2 = this->m_v3;
  uVar2 = this->m_v4;
  this->m_v3 = uVar2;
  uVar2 = uVar1 >> 8 ^ uVar2 >> 0x13 ^ uVar1 ^ uVar2;
  this->m_v4 = uVar2;
  return uVar2;
}

Assistant:

result_type gen()
        {
            const unsigned int t = (m_v1 ^ (m_v1 << 11));
            m_v1 = m_v2;
            m_v2 = m_v3;
            m_v3 = m_v4;
            m_v4 = (m_v4 ^ (m_v4 >> 19)) ^ (t ^ (t >> 8));
            return m_v4;
        }